

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::prepare_access_chain_for_scalar_access
          (CompilerMSL *this,string *expr,SPIRType *type,StorageClass storage,bool *is_packed)

{
  undefined1 local_98 [64];
  spirv_cross local_58 [32];
  char *local_38;
  char *addr_space;
  bool *is_packed_local;
  SPIRType *pSStack_20;
  StorageClass storage_local;
  SPIRType *type_local;
  string *expr_local;
  CompilerMSL *this_local;
  
  if (((*is_packed & 1U) == 0) &&
     ((storage == StorageClassStorageBuffer || (storage == StorageClassWorkgroup)))) {
    local_38 = "device";
    if (storage == StorageClassWorkgroup) {
      local_38 = "threadgroup";
    }
    addr_space = is_packed;
    is_packed_local._4_4_ = storage;
    pSStack_20 = type;
    type_local = (SPIRType *)expr;
    expr_local = (string *)this;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_98 + 0x20,this,type,0);
    CompilerGLSL::enclose_expression((CompilerGLSL *)local_98,(string *)this);
    join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (local_58,(char (*) [3])0x5f4922,&local_38,(char (*) [2])0x5eb360,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_98 + 0x20),(char (*) [4])"*)&",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator=((string *)type_local,(string *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    ::std::__cxx11::string::~string((string *)local_98);
    ::std::__cxx11::string::~string((string *)(local_98 + 0x20));
    *addr_space = '\x01';
  }
  return;
}

Assistant:

void CompilerMSL::prepare_access_chain_for_scalar_access(std::string &expr, const SPIRType &type,
                                                         spv::StorageClass storage, bool &is_packed)
{
	// If there is any risk of writes happening with the access chain in question,
	// and there is a risk of concurrent write access to other components,
	// we must cast the access chain to a plain pointer to ensure we only access the exact scalars we expect.
	// The MSL compiler refuses to allow component-level access for any non-packed vector types.
	if (!is_packed && (storage == StorageClassStorageBuffer || storage == StorageClassWorkgroup))
	{
		const char *addr_space = storage == StorageClassWorkgroup ? "threadgroup" : "device";
		expr = join("((", addr_space, " ", type_to_glsl(type), "*)&", enclose_expression(expr), ")");

		// Further indexing should happen with packed rules (array index, not swizzle).
		is_packed = true;
	}
}